

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

wchar_t * PostEffectTypeString(Types type)

{
  if (type - Early < 3) {
    return (wchar_t *)(&DAT_006d9160 + *(int *)(&DAT_006d9160 + (ulong)(type - Early) * 4));
  }
  ON_REMOVE_ASAP_AssertEx
            (0,
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
             ,0x7a,"","false is false");
  return L"";
}

Assistant:

static const wchar_t* PostEffectTypeString(ON_PostEffect::Types type)
{
  switch (type)
  {
    case ON_PostEffect::Types::Early:       return ON_RDK_PEP_TYPE_EARLY;
    case ON_PostEffect::Types::ToneMapping: return ON_RDK_PEP_TYPE_TONE_MAPPING;
    case ON_PostEffect::Types::Late:        return ON_RDK_PEP_TYPE_LATE;
    default: ON_ASSERT(false); return L"";
  }
}